

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_match_expression_init(parser_info *info,char **attr)

{
  char *path_00;
  coda_detection_rule_entry *pcVar1;
  char *path;
  char **attr_local;
  parser_info *info_local;
  
  path_00 = get_attribute_value(attr,"path");
  info->node->free_data = coda_detection_rule_entry_delete;
  pcVar1 = coda_detection_rule_entry_new(path_00);
  info->node->data = pcVar1;
  if (info->node->data == (void *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_expression_finalise;
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_match_expression_init(parser_info *info, const char **attr)
{
    const char *path;

    path = get_attribute_value(attr, "path");

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;
    info->node->data = coda_detection_rule_entry_new(path);
    if (info->node->data == NULL)
    {
        return -1;
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_expression_finalise;

    return 0;
}